

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uint stbiw__crc32(uchar *buffer,int len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (stbiw__crc32::crc_table[1] == 0) {
    uVar1 = 0;
    do {
      iVar2 = 8;
      uVar4 = uVar1 & 0xffffffff;
      do {
        uVar3 = -((uint)uVar4 & 1) & 0xedb88320 ^ (uint)(uVar4 >> 1);
        uVar4 = (ulong)uVar3;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      stbiw__crc32::crc_table[uVar1] = uVar3;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x100);
  }
  if (len < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0xffffffff;
    uVar1 = 0;
    do {
      uVar3 = uVar3 >> 8 ^ stbiw__crc32::crc_table[uVar3 & 0xff ^ (uint)buffer[uVar1]];
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
    uVar3 = ~uVar3;
  }
  return uVar3;
}

Assistant:

unsigned int stbiw__crc32(unsigned char *buffer, int len)
{
   static unsigned int crc_table[256];
   unsigned int crc = ~0u;
   int i,j;
   if (crc_table[1] == 0)
      for(i=0; i < 256; i++)
         for (crc_table[i]=i, j=0; j < 8; ++j)
            crc_table[i] = (crc_table[i] >> 1) ^ (crc_table[i] & 1 ? 0xedb88320 : 0);
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}